

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextodfwriter.cpp
# Opt level: O0

void __thiscall
QTextOdfWriter::tableCellStyleElement
          (QTextOdfWriter *this,QXmlStreamWriter *writer,int *formatIndex,
          QTextTableCellFormat *format,bool hasBorder,int tableId,QTextTableFormat *tableFormatTmp)

{
  qreal qVar1;
  qreal qVar2;
  qreal qVar3;
  bool bVar4;
  VerticalAlignment VVar5;
  QString *in_RSI;
  byte in_R8B;
  long in_FS_OFFSET;
  QByteArrayView QVar6;
  QByteArrayView QVar7;
  QByteArrayView QVar8;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  QByteArrayView QVar11;
  QByteArrayView QVar12;
  QByteArrayView QVar13;
  QByteArrayView QVar14;
  QByteArrayView QVar15;
  QByteArrayView QVar16;
  QByteArrayView QVar17;
  QByteArrayView QVar18;
  QByteArrayView QVar19;
  QByteArrayView QVar20;
  QByteArrayView QVar21;
  QByteArrayView QVar22;
  QByteArrayView QVar23;
  QByteArrayView QVar24;
  qreal padding;
  qreal topPadding;
  QString pos;
  undefined8 in_stack_fffffffffffff748;
  int base;
  QString *pQVar25;
  undefined8 in_stack_fffffffffffff750;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_QLatin1String>,_QString>,_QLatin1String>,_QString>
  *this_00;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_QLatin1String>,_QString>,_QLatin1String>,_QString>
  *in_stack_fffffffffffff758;
  undefined4 in_stack_fffffffffffff760;
  BorderStyle in_stack_fffffffffffff764;
  undefined8 in_stack_fffffffffffff768;
  QChar fillChar;
  storage_type *local_7a0;
  undefined1 local_790 [40];
  QAnyStringView *local_768;
  QAnyStringView *local_760;
  storage_type *local_758;
  undefined1 local_748 [24];
  storage_type *local_730;
  undefined1 local_720 [24];
  storage_type *local_708;
  undefined1 local_6f8 [24];
  storage_type *local_6e0;
  undefined1 local_6d0 [24];
  undefined1 *local_6b8;
  undefined1 *puStack_6b0;
  undefined1 *local_6a8;
  QString *local_688;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_QLatin1String>,_QString>,_QLatin1String>,_QString>
  *local_680;
  storage_type *local_678;
  undefined1 local_668 [40];
  QAnyStringView *local_640;
  QAnyStringView *local_638;
  QString *local_618;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_QLatin1String>,_QString>,_QLatin1String>,_QString>
  *local_610;
  storage_type *local_608;
  undefined1 local_5f8 [40];
  QAnyStringView *local_5d0;
  QAnyStringView *local_5c8;
  QString *local_5a8;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_QLatin1String>,_QString>,_QLatin1String>,_QString>
  *local_5a0;
  storage_type *local_598;
  undefined1 local_588 [40];
  QAnyStringView *local_560;
  QAnyStringView *local_558;
  QString *local_538;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_QLatin1String>,_QString>,_QLatin1String>,_QString>
  *local_530;
  storage_type *local_528;
  undefined1 local_518 [40];
  QAnyStringView *local_4f0;
  QAnyStringView *local_4e8;
  QString *local_4c8;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_QLatin1String>,_QString>,_QLatin1String>,_QString>
  *local_4c0;
  storage_type *local_4b8;
  undefined1 local_4a8 [40];
  QAnyStringView *local_480;
  QAnyStringView *local_478;
  QLatin1StringView local_438;
  QLatin1StringView local_410;
  QString *local_2c8;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_QLatin1String>,_QString>,_QLatin1String>,_QString>
  *local_2c0;
  storage_type *local_2b8;
  undefined1 local_2a8 [40];
  QAnyStringView *local_280;
  QAnyStringView *local_278;
  storage_type *local_270;
  undefined1 local_260 [40];
  QAnyStringView *local_238;
  storage_type *local_228;
  undefined1 local_218 [24];
  QString *local_200;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_QLatin1String>,_QString>,_QLatin1String>,_QString>
  *local_1f8;
  storage_type *local_1f0;
  undefined1 local_1e0 [40];
  QAnyStringView *local_1b8;
  QAnyStringView *local_1b0;
  QChar local_1a2;
  storage_type *local_1a0;
  undefined1 local_190 [64];
  storage_type *local_150;
  undefined1 local_140 [40];
  QAnyStringView *local_118;
  QAnyStringView *local_110;
  QChar local_104;
  QChar local_102;
  storage_type *local_100;
  undefined1 local_f0 [88];
  storage_type *local_98;
  undefined1 local_88 [40];
  QAnyStringView *local_60;
  QAnyStringView *local_58;
  storage_type *local_50;
  undefined1 local_40 [40];
  QAnyStringView *local_18;
  long local_8;
  
  fillChar.ucs = (char16_t)((ulong)in_stack_fffffffffffff768 >> 0x30);
  base = (int)((ulong)in_stack_fffffffffffff748 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QAnyStringView::QAnyStringView
            ((QAnyStringView *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
             (QString *)in_stack_fffffffffffff758);
  QByteArrayView::QByteArrayView<6ul>
            ((QByteArrayView *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
             (char (*) [6])in_stack_fffffffffffff758);
  QVar6.m_data = local_50;
  QVar6.m_size = (qsizetype)local_40;
  QString::fromLatin1(QVar6);
  QAnyStringView::QAnyStringView
            ((QAnyStringView *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
             (QString *)in_stack_fffffffffffff758);
  QXmlStreamWriter::writeStartElement((QAnyStringView *)in_RSI,local_18);
  QString::~QString((QString *)0x9f43e1);
  if ((in_R8B & 1) == 0) {
    QAnyStringView::QAnyStringView
              ((QAnyStringView *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
               (QString *)in_stack_fffffffffffff758);
    QByteArrayView::QByteArrayView<5ul>
              ((QByteArrayView *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
               (char (*) [5])in_stack_fffffffffffff758);
    QVar9.m_data = local_150;
    QVar9.m_size = (qsizetype)local_140;
    QString::fromLatin1(QVar9);
    QAnyStringView::QAnyStringView
              ((QAnyStringView *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
               (QString *)in_stack_fffffffffffff758);
    QByteArrayView::QByteArrayView<4ul>
              ((QByteArrayView *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
               (char (*) [4])in_stack_fffffffffffff758);
    QVar10.m_data = local_1a0;
    QVar10.m_size = (qsizetype)local_190;
    QString::fromLatin1(QVar10);
    QChar::QChar<char16_t,_true>(&local_1a2,L' ');
    QString::arg<int,_true>
              ((QString *)in_stack_fffffffffffff758,(int)((ulong)in_stack_fffffffffffff750 >> 0x20),
               (int)in_stack_fffffffffffff750,base,fillChar);
    QAnyStringView::QAnyStringView
              ((QAnyStringView *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
               (QString *)in_stack_fffffffffffff758);
    QXmlStreamWriter::writeAttribute((QAnyStringView *)in_RSI,local_118,local_110);
    QString::~QString((QString *)0x9f4716);
    QString::~QString((QString *)0x9f4723);
    QString::~QString((QString *)0x9f4730);
  }
  else {
    QAnyStringView::QAnyStringView
              ((QAnyStringView *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
               (QString *)in_stack_fffffffffffff758);
    QByteArrayView::QByteArrayView<5ul>
              ((QByteArrayView *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
               (char (*) [5])in_stack_fffffffffffff758);
    QVar7.m_data = local_98;
    QVar7.m_size = (qsizetype)local_88;
    QString::fromLatin1(QVar7);
    QAnyStringView::QAnyStringView
              ((QAnyStringView *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
               (QString *)in_stack_fffffffffffff758);
    QByteArrayView::QByteArrayView<8ul>
              ((QByteArrayView *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
               (char (*) [8])in_stack_fffffffffffff758);
    QVar8.m_data = local_100;
    QVar8.m_size = (qsizetype)local_f0;
    QString::fromLatin1(QVar8);
    QChar::QChar<char16_t,_true>(&local_102,L' ');
    QString::arg<int,_true>
              ((QString *)in_stack_fffffffffffff758,(int)((ulong)in_stack_fffffffffffff750 >> 0x20),
               (int)in_stack_fffffffffffff750,base,fillChar);
    QChar::QChar<char16_t,_true>(&local_104,L' ');
    QString::arg<int,_true>
              ((QString *)in_stack_fffffffffffff758,(int)((ulong)in_stack_fffffffffffff750 >> 0x20),
               (int)in_stack_fffffffffffff750,base,fillChar);
    QAnyStringView::QAnyStringView
              ((QAnyStringView *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
               (QString *)in_stack_fffffffffffff758);
    QXmlStreamWriter::writeAttribute((QAnyStringView *)in_RSI,local_60,local_58);
    QString::~QString((QString *)0x9f4593);
    QString::~QString((QString *)0x9f45a0);
    QString::~QString((QString *)0x9f45ad);
    QString::~QString((QString *)0x9f45ba);
  }
  QAnyStringView::QAnyStringView
            ((QAnyStringView *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
             (QString *)in_stack_fffffffffffff758);
  QByteArrayView::QByteArrayView<7ul>
            ((QByteArrayView *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
             (char (*) [7])in_stack_fffffffffffff758);
  QVar11.m_data = local_1f0;
  QVar11.m_size = (qsizetype)local_1e0;
  QString::fromLatin1(QVar11);
  QAnyStringView::QAnyStringView
            ((QAnyStringView *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
             (QString *)in_stack_fffffffffffff758);
  QByteArrayView::QByteArrayView<11ul>
            ((QByteArrayView *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
             (char (*) [11])in_stack_fffffffffffff758);
  QVar12.m_data = local_228;
  QVar12.m_size = (qsizetype)local_218;
  QString::fromLatin1(QVar12);
  QAnyStringView::QAnyStringView
            ((QAnyStringView *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
             (QString *)in_stack_fffffffffffff758);
  QXmlStreamWriter::writeAttribute((QAnyStringView *)in_RSI,local_1b8,local_1b0);
  QString::~QString((QString *)0x9f4837);
  QString::~QString((QString *)0x9f4844);
  QAnyStringView::QAnyStringView
            ((QAnyStringView *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
             (QString *)in_stack_fffffffffffff758);
  QByteArrayView::QByteArrayView<22ul>
            ((QByteArrayView *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
             (char (*) [22])in_stack_fffffffffffff758);
  QVar13.m_data = local_270;
  QVar13.m_size = (qsizetype)local_260;
  QString::fromLatin1(QVar13);
  QAnyStringView::QAnyStringView
            ((QAnyStringView *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
             (QString *)in_stack_fffffffffffff758);
  QXmlStreamWriter::writeEmptyElement((QAnyStringView *)in_RSI,local_238);
  QString::~QString((QString *)0x9f48ed);
  pQVar25 = local_200;
  this_00 = local_1f8;
  if ((in_R8B & 1) != 0) {
    QAnyStringView::QAnyStringView
              ((QAnyStringView *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
               (QString *)in_stack_fffffffffffff758);
    QByteArrayView::QByteArrayView<7ul>
              ((QByteArrayView *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
               (char (*) [7])in_stack_fffffffffffff758);
    QVar14.m_data = local_2b8;
    QVar14.m_size = (qsizetype)local_2a8;
    QString::fromLatin1(QVar14);
    QAnyStringView::QAnyStringView
              ((QAnyStringView *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
               (QString *)in_stack_fffffffffffff758);
    QTextFrameFormat::border((QTextFrameFormat *)0x9f4977);
    pixelToPoint((qreal)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760));
    local_410 = Qt::Literals::StringLiterals::operator____L1
                          ((char *)in_stack_fffffffffffff758,(size_t)local_1f8);
    ::operator+((QString *)in_stack_fffffffffffff758,(QLatin1String *)local_1f8);
    QTextFrameFormat::borderStyle((QTextFrameFormat *)0x9f49cf);
    borderStyleName(in_stack_fffffffffffff764);
    ::operator+((QStringBuilder<QString,_QLatin1String> *)in_stack_fffffffffffff758,
                (QString *)local_1f8);
    local_438 = Qt::Literals::StringLiterals::operator____L1
                          ((char *)in_stack_fffffffffffff758,(size_t)local_1f8);
    ::operator+((QStringBuilder<QStringBuilder<QString,_QLatin1String>,_QString> *)
                in_stack_fffffffffffff758,(QLatin1String *)local_1f8);
    QTextFrameFormat::borderBrush((QTextFrameFormat *)local_200);
    QBrush::color((QBrush *)0x9f4a5b);
    QColor::name((QColor *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
                 (NameFormat)((ulong)in_stack_fffffffffffff758 >> 0x20));
    ::operator+(&in_stack_fffffffffffff758->a,(QString *)local_1f8);
    QString::QString((QString *)0x9f4a97);
    QAnyStringView::
    QAnyStringView<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_QLatin1String>,_QString>,_QLatin1String>,_QString>,_true>
              ((QAnyStringView *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
               in_stack_fffffffffffff758,
               (wrapped_t<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_QLatin1String>,_QString>,_QLatin1String>,_QString>,_QString>
                *)local_1f8);
    QXmlStreamWriter::writeAttribute((QAnyStringView *)in_RSI,local_280,local_278);
    QString::~QString((QString *)0x9f4b06);
    QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_QLatin1String>,_QString>,_QLatin1String>,_QString>
    ::~QStringBuilder(local_2c0);
    QString::~QString((QString *)0x9f4b20);
    QBrush::~QBrush((QBrush *)0x9f4b2d);
    QStringBuilder<QStringBuilder<QStringBuilder<QString,_QLatin1String>,_QString>,_QLatin1String>::
    ~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QString,_QLatin1String>,_QString>,_QLatin1String>
                     *)0x9f4b3a);
    QStringBuilder<QStringBuilder<QString,_QLatin1String>,_QString>::~QStringBuilder
              ((QStringBuilder<QStringBuilder<QString,_QLatin1String>,_QString> *)local_2c0);
    QString::~QString((QString *)0x9f4b54);
    QStringBuilder<QString,_QLatin1String>::~QStringBuilder
              ((QStringBuilder<QString,_QLatin1String> *)0x9f4b61);
    QString::~QString((QString *)0x9f4b6e);
    QString::~QString((QString *)0x9f4b7b);
    pQVar25 = local_2c8;
    this_00 = local_2c0;
  }
  qVar1 = QTextTableCellFormat::topPadding((QTextTableCellFormat *)0x9f4b88);
  qVar2 = QTextTableFormat::cellPadding((QTextTableFormat *)0x9f4bad);
  if (((0.0 < qVar1 + qVar2) &&
      (qVar3 = QTextTableCellFormat::bottomPadding((QTextTableCellFormat *)0x9f4bf5), qVar1 == qVar3
      )) && (qVar3 = QTextTableCellFormat::leftPadding((QTextTableCellFormat *)0x9f4c2a),
            qVar1 == qVar3)) {
    qVar3 = QTextTableCellFormat::rightPadding((QTextTableCellFormat *)0x9f4c5f);
    if ((qVar1 == qVar3) && (!NAN(qVar1) && !NAN(qVar3))) {
      QAnyStringView::QAnyStringView
                ((QAnyStringView *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
                 (QString *)in_stack_fffffffffffff758);
      QByteArrayView::QByteArrayView<8ul>
                ((QByteArrayView *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
                 (char (*) [8])in_stack_fffffffffffff758);
      QVar15.m_data = local_4b8;
      QVar15.m_size = (qsizetype)local_4a8;
      QString::fromLatin1(QVar15);
      QAnyStringView::QAnyStringView
                ((QAnyStringView *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
                 (QString *)in_stack_fffffffffffff758);
      pixelToPoint((qreal)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760));
      QAnyStringView::QAnyStringView
                ((QAnyStringView *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
                 (QString *)in_stack_fffffffffffff758);
      QXmlStreamWriter::writeAttribute((QAnyStringView *)in_RSI,local_480,local_478);
      QString::~QString((QString *)0x9f4d5e);
      QString::~QString((QString *)0x9f4d6b);
      pQVar25 = local_4c8;
      this_00 = local_4c0;
      goto LAB_009f5238;
    }
  }
  if (0.0 < qVar1 + qVar2) {
    QAnyStringView::QAnyStringView
              ((QAnyStringView *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
               (QString *)in_stack_fffffffffffff758);
    QByteArrayView::QByteArrayView<12ul>
              ((QByteArrayView *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
               (char (*) [12])in_stack_fffffffffffff758);
    QVar16.m_data = local_528;
    QVar16.m_size = (qsizetype)local_518;
    QString::fromLatin1(QVar16);
    QAnyStringView::QAnyStringView
              ((QAnyStringView *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
               (QString *)in_stack_fffffffffffff758);
    pixelToPoint((qreal)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760));
    QAnyStringView::QAnyStringView
              ((QAnyStringView *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
               (QString *)in_stack_fffffffffffff758);
    QXmlStreamWriter::writeAttribute((QAnyStringView *)in_RSI,local_4f0,local_4e8);
    QString::~QString((QString *)0x9f4e6c);
    QString::~QString((QString *)0x9f4e79);
    pQVar25 = local_538;
    this_00 = local_530;
  }
  qVar1 = QTextTableCellFormat::bottomPadding((QTextTableCellFormat *)0x9f4e86);
  qVar2 = QTextTableFormat::cellPadding((QTextTableFormat *)0x9f4e99);
  if (0.0 < qVar1 + qVar2) {
    QAnyStringView::QAnyStringView
              ((QAnyStringView *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
               (QString *)in_stack_fffffffffffff758);
    QByteArrayView::QByteArrayView<15ul>
              ((QByteArrayView *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
               (char (*) [15])in_stack_fffffffffffff758);
    QVar17.m_data = local_598;
    QVar17.m_size = (qsizetype)local_588;
    QString::fromLatin1(QVar17);
    QAnyStringView::QAnyStringView
              ((QAnyStringView *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
               (QString *)in_stack_fffffffffffff758);
    pixelToPoint((qreal)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760));
    QAnyStringView::QAnyStringView
              ((QAnyStringView *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
               (QString *)in_stack_fffffffffffff758);
    QXmlStreamWriter::writeAttribute((QAnyStringView *)in_RSI,local_560,local_558);
    QString::~QString((QString *)0x9f4fab);
    QString::~QString((QString *)0x9f4fb8);
    pQVar25 = local_5a8;
    this_00 = local_5a0;
  }
  qVar1 = QTextTableCellFormat::leftPadding((QTextTableCellFormat *)0x9f4fc5);
  qVar2 = QTextTableFormat::cellPadding((QTextTableFormat *)0x9f4fd8);
  if (0.0 < qVar1 + qVar2) {
    QAnyStringView::QAnyStringView
              ((QAnyStringView *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
               (QString *)in_stack_fffffffffffff758);
    QByteArrayView::QByteArrayView<13ul>
              ((QByteArrayView *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
               (char (*) [13])in_stack_fffffffffffff758);
    QVar18.m_data = local_608;
    QVar18.m_size = (qsizetype)local_5f8;
    QString::fromLatin1(QVar18);
    QAnyStringView::QAnyStringView
              ((QAnyStringView *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
               (QString *)in_stack_fffffffffffff758);
    pixelToPoint((qreal)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760));
    QAnyStringView::QAnyStringView
              ((QAnyStringView *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
               (QString *)in_stack_fffffffffffff758);
    QXmlStreamWriter::writeAttribute((QAnyStringView *)in_RSI,local_5d0,local_5c8);
    QString::~QString((QString *)0x9f50ea);
    QString::~QString((QString *)0x9f50f7);
    pQVar25 = local_618;
    this_00 = local_610;
  }
  qVar1 = QTextTableCellFormat::rightPadding((QTextTableCellFormat *)0x9f5104);
  qVar2 = QTextTableFormat::cellPadding((QTextTableFormat *)0x9f5117);
  if (0.0 < qVar1 + qVar2) {
    pQVar25 = in_RSI;
    QAnyStringView::QAnyStringView
              ((QAnyStringView *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
               (QString *)in_stack_fffffffffffff758);
    QByteArrayView::QByteArrayView<14ul>
              ((QByteArrayView *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
               (char (*) [14])in_stack_fffffffffffff758);
    QVar19.m_data = local_678;
    QVar19.m_size = (qsizetype)local_668;
    QString::fromLatin1(QVar19);
    QAnyStringView::QAnyStringView
              ((QAnyStringView *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
               (QString *)in_stack_fffffffffffff758);
    pixelToPoint((qreal)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760));
    QAnyStringView::QAnyStringView
              ((QAnyStringView *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
               (QString *)in_stack_fffffffffffff758);
    QXmlStreamWriter::writeAttribute((QAnyStringView *)pQVar25,local_640,local_638);
    QString::~QString((QString *)0x9f5229);
    QString::~QString((QString *)0x9f5236);
    pQVar25 = local_688;
    this_00 = local_680;
  }
LAB_009f5238:
  bVar4 = QTextFormat::hasProperty
                    ((QTextFormat *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
                     (int)((ulong)in_stack_fffffffffffff758 >> 0x20));
  if (bVar4) {
    local_6b8 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_6b0 = &DAT_aaaaaaaaaaaaaaaa;
    local_6a8 = &DAT_aaaaaaaaaaaaaaaa;
    QString::QString((QString *)0x9f5281);
    VVar5 = QTextCharFormat::verticalAlignment((QTextCharFormat *)0x9f528e);
    if (VVar5 == AlignMiddle) {
      QByteArrayView::QByteArrayView<7ul>
                ((QByteArrayView *)CONCAT44(3,in_stack_fffffffffffff760),
                 (char (*) [7])in_stack_fffffffffffff758);
      QVar20.m_data = local_6e0;
      QVar20.m_size = (qsizetype)local_6d0;
      QString::fromLatin1(QVar20);
      QString::operator=((QString *)this_00,pQVar25);
      QString::~QString((QString *)0x9f530b);
    }
    else if (VVar5 == AlignTop) {
      QByteArrayView::QByteArrayView<4ul>
                ((QByteArrayView *)CONCAT44(4,in_stack_fffffffffffff760),
                 (char (*) [4])in_stack_fffffffffffff758);
      QVar21.m_data = local_708;
      QVar21.m_size = (qsizetype)local_6f8;
      QString::fromLatin1(QVar21);
      QString::operator=((QString *)this_00,pQVar25);
      QString::~QString((QString *)0x9f5363);
    }
    else if (VVar5 == AlignBottom) {
      QByteArrayView::QByteArrayView<7ul>
                ((QByteArrayView *)CONCAT44(5,in_stack_fffffffffffff760),
                 (char (*) [7])in_stack_fffffffffffff758);
      QVar22.m_data = local_730;
      QVar22.m_size = (qsizetype)local_720;
      QString::fromLatin1(QVar22);
      QString::operator=((QString *)this_00,pQVar25);
      QString::~QString((QString *)0x9f53bb);
    }
    else {
      QByteArrayView::QByteArrayView<10ul>
                ((QByteArrayView *)CONCAT44(VVar5,in_stack_fffffffffffff760),
                 (char (*) [10])in_stack_fffffffffffff758);
      QVar23.m_data = local_758;
      QVar23.m_size = (qsizetype)local_748;
      QString::fromLatin1(QVar23);
      QString::operator=((QString *)this_00,pQVar25);
      QString::~QString((QString *)0x9f5410);
    }
    QAnyStringView::QAnyStringView
              ((QAnyStringView *)CONCAT44(VVar5,in_stack_fffffffffffff760),in_RSI);
    QByteArrayView::QByteArrayView<15ul>
              ((QByteArrayView *)CONCAT44(VVar5,in_stack_fffffffffffff760),(char (*) [15])in_RSI);
    QVar24.m_data = local_7a0;
    QVar24.m_size = (qsizetype)local_790;
    QString::fromLatin1(QVar24);
    QAnyStringView::QAnyStringView
              ((QAnyStringView *)CONCAT44(VVar5,in_stack_fffffffffffff760),in_RSI);
    QAnyStringView::QAnyStringView
              ((QAnyStringView *)CONCAT44(VVar5,in_stack_fffffffffffff760),in_RSI);
    QXmlStreamWriter::writeAttribute((QAnyStringView *)in_RSI,local_768,local_760);
    QString::~QString((QString *)0x9f54e0);
    QString::~QString((QString *)0x9f54ed);
  }
  QXmlStreamWriter::writeEndElement();
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextOdfWriter::tableCellStyleElement(QXmlStreamWriter &writer, const int &formatIndex,
                                           const QTextTableCellFormat &format,
                                           bool hasBorder, int tableId,
                                           const QTextTableFormat tableFormatTmp) const {
    writer.writeStartElement(styleNS, QString::fromLatin1("style"));
    if (hasBorder) {
        writer.writeAttribute(styleNS, QString::fromLatin1("name"),
                              QString::fromLatin1("TB%1.%2").arg(tableId).arg(formatIndex));
    } else {
        writer.writeAttribute(styleNS, QString::fromLatin1("name"), QString::fromLatin1("T%1").arg(formatIndex));
    }
    writer.writeAttribute(styleNS, QString::fromLatin1("family"), QString::fromLatin1("table-cell"));
    writer.writeEmptyElement(styleNS, QString::fromLatin1("table-cell-properties"));
    if (hasBorder) {
        writer.writeAttribute(foNS, QString::fromLatin1("border"),
                              pixelToPoint(tableFormatTmp.border()) + " "_L1
                              + borderStyleName(tableFormatTmp.borderStyle()) + " "_L1
                              + tableFormatTmp.borderBrush().color().name(QColor::HexRgb));
    }
    qreal topPadding = format.topPadding();
    qreal padding = topPadding + tableFormatTmp.cellPadding();
    if (padding > 0 && topPadding == format.bottomPadding()
        && topPadding == format.leftPadding() && topPadding == format.rightPadding()) {
        writer.writeAttribute(foNS, QString::fromLatin1("padding"), pixelToPoint(padding));
    }
    else {
        if (padding > 0)
            writer.writeAttribute(foNS, QString::fromLatin1("padding-top"), pixelToPoint(padding));
        padding = format.bottomPadding() + tableFormatTmp.cellPadding();
        if (padding > 0)
            writer.writeAttribute(foNS, QString::fromLatin1("padding-bottom"),
                                  pixelToPoint(padding));
        padding = format.leftPadding() + tableFormatTmp.cellPadding();
        if (padding > 0)
            writer.writeAttribute(foNS, QString::fromLatin1("padding-left"),
                                  pixelToPoint(padding));
        padding = format.rightPadding() + tableFormatTmp.cellPadding();
        if (padding > 0)
            writer.writeAttribute(foNS, QString::fromLatin1("padding-right"),
                                  pixelToPoint(padding));
    }

    if (format.hasProperty(QTextFormat::TextVerticalAlignment)) {
        QString pos;
        switch (format.verticalAlignment()) {  // TODO - review: doesn't handle all cases
        case QTextCharFormat::AlignMiddle:
            pos = QString::fromLatin1("middle"); break;
        case QTextCharFormat::AlignTop:
            pos = QString::fromLatin1("top"); break;
        case QTextCharFormat::AlignBottom:
            pos = QString::fromLatin1("bottom"); break;
        default:
            pos = QString::fromLatin1("automatic"); break;
        }
        writer.writeAttribute(styleNS, QString::fromLatin1("vertical-align"), pos);
    }

    // TODO
    // ODF just search for style-table-cell-properties-attlist)
    // QTextFormat::BackgroundImageUrl
    // format.background
    writer.writeEndElement(); // style
}